

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O1

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::filter_expression::evaluate
          (filter_expression *this,reference val,
          eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          *context,error_code *ec)

{
  pointer ppeVar1;
  bool bVar2;
  semantic_tag sVar3;
  int iVar4;
  pointer this_00;
  undefined4 extraout_var;
  reference pbVar5;
  iterator doc;
  expr_base_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  **expression;
  pointer ppeVar6;
  iterator iVar7;
  const_array_range_type cVar8;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> j;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  new_context;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
  local_a8;
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *local_98;
  filter_expression *local_90;
  reference local_88;
  vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  *local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*>_>_>
  *local_78;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *local_70;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  local_68;
  iterator this_01;
  
  local_90 = this;
  bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_array(val);
  if (bVar2) {
    local_98 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
               eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
               ::create_json<jsoncons::json_array_arg_t_const&>
                         ((eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           *)context,(json_array_arg_t *)&json_array_arg);
    cVar8 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::array_range
                      (val);
    local_88 = (reference)cVar8.last_._M_current;
    if (cVar8.first_._M_current._M_current != local_88) {
      local_78 = &context->variables_;
      local_80 = &local_90->token_list_;
      do {
        iVar7 = cVar8.last_._M_current;
        doc = cVar8.first_._M_current;
        local_68.temp_storage_ = context->temp_storage_;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*>_>_>
        ::_Rb_tree(&local_68.variables_._M_t,&local_78->_M_t);
        this_00 = (pointer)evaluate_tokens(doc._M_current,local_80,&local_68,ec);
        if (this_00 == (pointer)0x0) {
          local_a8.common_ = (common_storage)0x0;
        }
        else {
          local_a8.json_ref_ = (json_reference_storage)8;
          sVar3 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::tag
                            ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                              *)this_00);
          local_a8.common_.tag_ = sVar3;
          local_a8.int64_.val_ = (int64_t)this_00;
        }
        bVar2 = is_false((reference)&local_a8.common_);
        if (!bVar2) {
          ppeVar1 = (local_90->super_projection_base).expressions_.
                    super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          this_01._M_current = doc._M_current;
          for (ppeVar6 = (local_90->super_projection_base).expressions_.
                         super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>
                         ._M_impl.super__Vector_impl_data._M_start; ppeVar6 != ppeVar1;
              ppeVar6 = ppeVar6 + 1) {
            iVar4 = (*((*ppeVar6)->
                      super_expr_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                      )._vptr_expr_base[2])(*ppeVar6,this_01._M_current,context,ec);
            this_01._M_current =
                 (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar4);
          }
          bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                  is_null(this_01._M_current);
          iVar7._M_current = local_88;
          if (!bVar2) {
            local_70 = this_01._M_current;
            basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
            emplace_back<jsoncons::json_const_pointer_arg_t_const&,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>const*>
                      (local_98,(json_const_pointer_arg_t *)&json_const_pointer_arg,&local_70);
          }
        }
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::destroy
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   &local_a8.common_);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*>_>_>
        ::~_Rb_tree(&local_68.variables_._M_t);
        cVar8.last_._M_current = iVar7._M_current;
        cVar8.first_._M_current = doc._M_current + 1;
      } while (doc._M_current + 1 != iVar7._M_current);
    }
    return (reference)local_98;
  }
  pbVar5 = eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           ::null_value(context);
  return pbVar5;
}

Assistant:

reference evaluate(reference val, eval_context<Json>& context, std::error_code& ec) const override
            {
                if (!val.is_array())
                {
                    return context.null_value();
                }
                auto result = context.create_json(json_array_arg);

                for (auto& item : val.array_range())
                {
                    eval_context<Json> new_context{ context.temp_storage_, context.variables_ };
                    Json j(json_const_pointer_arg, evaluate_tokens(item, token_list_, new_context, ec));
                    if (is_true(j))
                    {
                        reference jj = this->apply_expressions(item, context, ec);
                        if (!jj.is_null())
                        {
                            result->emplace_back(json_const_pointer_arg, std::addressof(jj));
                        }
                    }
                }
                return *result;
            }